

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_implicit_global_from_local(REF_NODE ref_node)

{
  uint uVar1;
  void *array;
  REF_GLOB *vector;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_GLOB offset;
  REF_GLOB *everyones_nnode;
  REF_GLOB *global;
  REF_GLOB nnode;
  REF_INT proc;
  REF_INT node;
  REF_MPI ref_mpi;
  REF_NODE ref_node_local;
  
  _proc = ref_node->ref_mpi;
  ref_mpi = (REF_MPI)ref_node;
  uVar1 = ref_node_synchronize_globals(ref_node);
  if (uVar1 == 0) {
    global = (REF_GLOB *)0x0;
    for (nnode._4_4_ = 0; nnode._4_4_ < ref_mpi->id; nnode._4_4_ = nnode._4_4_ + 1) {
      if ((((-1 < nnode._4_4_) && (nnode._4_4_ < ref_mpi->id)) &&
          (-1 < *(long *)((long)ref_mpi->comm + (long)nnode._4_4_ * 8))) &&
         (*(int *)((long)ref_mpi[1].start_time + 4) ==
          *(int *)(*(long *)&ref_mpi->native_alltoallv + (long)nnode._4_4_ * 4))) {
        global = (REF_GLOB *)((long)global + 1);
      }
    }
    if (_proc->n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x311,
             "ref_node_implicit_global_from_local","malloc everyones_nnode of REF_GLOB negative");
      ref_node_local._4_4_ = 1;
    }
    else {
      array = malloc((long)_proc->n << 3);
      if (array == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x311,"ref_node_implicit_global_from_local","malloc everyones_nnode of REF_GLOB NULL"
              );
        ref_node_local._4_4_ = 2;
      }
      else {
        uVar1 = ref_mpi_allgather(_proc,&global,array,2);
        if (uVar1 == 0) {
          _ref_private_macro_code_rss_1 = 0;
          for (nnode._0_4_ = 0; (int)nnode < _proc->id; nnode._0_4_ = (int)nnode + 1) {
            _ref_private_macro_code_rss_1 =
                 *(long *)((long)array + (long)(int)nnode * 8) + _ref_private_macro_code_rss_1;
          }
          if (array != (void *)0x0) {
            free(array);
          }
          if (ref_mpi->id < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x31a,"ref_node_implicit_global_from_local","malloc global of REF_GLOB negative")
            ;
            ref_node_local._4_4_ = 1;
          }
          else {
            vector = (REF_GLOB *)malloc((long)ref_mpi->id << 3);
            if (vector == (REF_GLOB *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x31a,"ref_node_implicit_global_from_local","malloc global of REF_GLOB NULL");
              ref_node_local._4_4_ = 2;
            }
            else {
              global = (REF_GLOB *)0x0;
              for (nnode._4_4_ = 0; nnode._4_4_ < ref_mpi->id; nnode._4_4_ = nnode._4_4_ + 1) {
                if (((-1 < nnode._4_4_) && (nnode._4_4_ < ref_mpi->id)) &&
                   ((-1 < *(long *)((long)ref_mpi->comm + (long)nnode._4_4_ * 8) &&
                    (*(int *)((long)ref_mpi[1].start_time + 4) ==
                     *(int *)(*(long *)&ref_mpi->native_alltoallv + (long)nnode._4_4_ * 4))))) {
                  vector[nnode._4_4_] = _ref_private_macro_code_rss_1 + (long)global;
                  global = (REF_GLOB *)((long)global + 1);
                }
              }
              uVar1 = ref_node_ghost_glob((REF_NODE)ref_mpi,vector,1);
              if (uVar1 == 0) {
                for (nnode._4_4_ = 0; nnode._4_4_ < ref_mpi->id; nnode._4_4_ = nnode._4_4_ + 1) {
                  if (((-1 < nnode._4_4_) && (nnode._4_4_ < ref_mpi->id)) &&
                     (-1 < *(long *)((long)ref_mpi->comm + (long)nnode._4_4_ * 8))) {
                    *(REF_GLOB *)((long)ref_mpi->comm + (long)nnode._4_4_ * 8) = vector[nnode._4_4_]
                    ;
                  }
                }
                if (vector != (REF_GLOB *)0x0) {
                  free(vector);
                }
                ref_node_local._4_4_ = ref_node_rebuild_sorted_global((REF_NODE)ref_mpi);
                if (ref_node_local._4_4_ == 0) {
                  ref_node_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                         ,0x32c,"ref_node_implicit_global_from_local",(ulong)ref_node_local._4_4_,
                         "rebuild globals");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x324,"ref_node_implicit_global_from_local",(ulong)uVar1,"ghost int");
                ref_node_local._4_4_ = uVar1;
              }
            }
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x313,"ref_node_implicit_global_from_local",(ulong)uVar1,"allgather");
          ref_node_local._4_4_ = uVar1;
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x308,
           "ref_node_implicit_global_from_local",(ulong)uVar1,"sync");
    ref_node_local._4_4_ = uVar1;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_implicit_global_from_local(REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT node, proc;
  REF_GLOB nnode, *global;
  REF_GLOB *everyones_nnode, offset;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      nnode++;
    }
  }

  ref_malloc(everyones_nnode, ref_mpi_n(ref_mpi), REF_GLOB);
  RSS(ref_mpi_allgather(ref_mpi, &nnode, everyones_nnode, REF_GLOB_TYPE),
      "allgather");

  offset = 0;
  for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++)
    offset += everyones_nnode[proc];

  ref_free(everyones_nnode);
  ref_malloc(global, ref_node_max(ref_node), REF_GLOB);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      global[node] = offset + nnode;
      nnode++;
    }
  }

  RSS(ref_node_ghost_glob(ref_node, global, 1), "ghost int");

  each_ref_node_valid_node(ref_node, node) {
    ref_node->global[node] = global[node];
  }

  ref_free(global);

  RSS(ref_node_rebuild_sorted_global(ref_node), "rebuild globals");

  return REF_SUCCESS;
}